

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_last_not_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  StringPiece characters_wanted;
  byte local_148 [8];
  bool lookup [256];
  unsigned_long local_40;
  unsigned_long local_38;
  size_type i;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  i = pos;
  pos_local = (size_type)this;
  bVar1 = empty(this);
  if (bVar1) {
    s_local.length_ = 0xffffffffffffffff;
  }
  else {
    sVar2 = length(this);
    local_40 = sVar2 - 1;
    puVar3 = std::min<unsigned_long>(&i,&local_40);
    local_38 = *puVar3;
    bVar1 = empty((StringPiece *)&this_local);
    if (bVar1) {
      s_local.length_ = local_38;
    }
    else if (s_local.ptr_ == (char *)0x1) {
      s_local.length_ = find_last_not_of(this,*(char *)&this_local->ptr_,i);
    }
    else {
      memset(local_148,0,0x100);
      characters_wanted.length_ = (size_type)local_148;
      characters_wanted.ptr_ = s_local.ptr_;
      BuildLookupTable((stringpiece_internal *)this_local,characters_wanted,(bool *)pos);
      while ((local_148[(byte)this->ptr_[local_38]] & 1) != 0) {
        if (local_38 == 0) {
          return 0xffffffffffffffff;
        }
        local_38 = local_38 - 1;
      }
      s_local.length_ = local_38;
    }
  }
  return s_local.length_;
}

Assistant:

StringPiece::size_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (empty()) return npos;

  size_type i = std::min(pos, length() - 1);
  if (s.empty()) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (;; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}